

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesDriverEventListenPrologue
          (ZESParameterValidation *this,ze_driver_handle_t hDriver,uint32_t timeout,uint32_t count,
          zes_device_handle_t *phDevices,uint32_t *pNumDeviceEvents,zes_event_type_flags_t *pEvents)

{
  uint32_t *pNumDeviceEvents_local;
  zes_device_handle_t *phDevices_local;
  uint32_t count_local;
  uint32_t timeout_local;
  ze_driver_handle_t hDriver_local;
  ZESParameterValidation *this_local;
  
  if (hDriver == (ze_driver_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (phDevices == (zes_device_handle_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pNumDeviceEvents == (uint32_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pEvents == (zes_event_type_flags_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    this_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesDriverEventListenPrologue(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint32_t timeout,                               ///< [in] if non-zero, then indicates the maximum time (in milliseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then will check status and return immediately;
                                                        ///< if `UINT32_MAX`, then function will not return until events arrive.
        uint32_t count,                                 ///< [in] Number of device handles in phDevices.
        zes_device_handle_t* phDevices,                 ///< [in][range(0, count)] Device handles to listen to for events. Only
                                                        ///< devices from the provided driver handle can be specified in this list.
        uint32_t* pNumDeviceEvents,                     ///< [in,out] Will contain the actual number of devices in phDevices that
                                                        ///< generated events. If non-zero, check pEvents to determine the devices
                                                        ///< and events that were received.
        zes_event_type_flags_t* pEvents                 ///< [in,out] An array that will continue the list of events for each
                                                        ///< device listened in phDevices.
                                                        ///< This array must be at least as big as count.
                                                        ///< For every device handle in phDevices, this will provide the events
                                                        ///< that occurred for that device at the same position in this array. If
                                                        ///< no event was received for a given device, the corresponding array
                                                        ///< entry will be zero.
        )
    {
        if( nullptr == hDriver )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == phDevices )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pNumDeviceEvents )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pEvents )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }